

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c.cpp
# Opt level: O2

size_type fs_absolute(char *path,char *base,bool expand_tilde,char *out,size_type buffer_size)

{
  size_t sVar1;
  size_t sVar2;
  size_type sVar3;
  string_view s;
  string_view path_00;
  string_view base_00;
  string local_50;
  
  sVar1 = strlen(path);
  sVar2 = strlen(base);
  path_00._M_str = path;
  path_00._M_len = sVar1;
  base_00._M_str = base;
  base_00._M_len = sVar2;
  fs_absolute_abi_cxx11_(&local_50,path_00,base_00,expand_tilde);
  s._M_str = local_50._M_dataplus._M_p;
  s._M_len = local_50._M_string_length;
  sVar3 = fs_str2char(s,out,buffer_size);
  std::__cxx11::string::~string((string *)&local_50);
  return sVar3;
}

Assistant:

std::string::size_type fs_absolute(const char* path, const char* base, const bool expand_tilde,
                          char* out, const std::string::size_type buffer_size){
  return fs_str2char(fs_absolute(path, base, expand_tilde), out, buffer_size);
}